

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Tag * __thiscall wasm::Module::addTag(Module *this,Tag *curr)

{
  Tag *pTVar1;
  allocator<char> local_39;
  string local_38;
  Tag *local_18;
  Tag *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (Tag *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"addTag",&local_39);
  pTVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>,std::unordered_map<wasm::Name,wasm::Tag*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Tag*>>>,wasm::Tag>
                     (&this->tags,&this->tagsMap,curr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return pTVar1;
}

Assistant:

Tag* Module::addTag(Tag* curr) {
  return addModuleElement(tags, tagsMap, curr, "addTag");
}